

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators_test.cpp
# Opt level: O2

void CheckSceneAverage(string *filename,float expected)

{
  Allocator alloc;
  ImageAndMetadata *pIVar1;
  Tuple2<pbrt::Point2,_int> TVar2;
  long lVar3;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this
  ;
  char *pcVar4;
  char *in_R9;
  int c;
  int c_00;
  int s;
  ulong uVar5;
  Float FVar6;
  int iVar7;
  undefined4 in_stack_fffffffffffffb4c;
  undefined4 in_stack_fffffffffffffb50;
  float fVar8;
  AssertionResult gtest_ar_;
  AssertHelper in_stack_fffffffffffffb68;
  undefined4 in_stack_fffffffffffffb70;
  WrapMode2D local_478;
  ColorEncodingHandle local_470;
  AssertionResult gtest_ar;
  optional<pbrt::ImageAndMetadata> im;
  
  alloc.memoryResource = pstd::pmr::new_delete_resource();
  local_470.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          )0;
  pbrt::Image::Read((ImageAndMetadata *)&gtest_ar,filename,alloc,&local_470);
  pstd::optional<pbrt::ImageAndMetadata>::optional(&im,(ImageAndMetadata *)&gtest_ar);
  pbrt::ImageAndMetadata::~ImageAndMetadata((ImageAndMetadata *)&gtest_ar);
  this = &gtest_ar_.message_;
  gtest_ar_.success_ = im.set;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (im.set == false) {
    testing::Message::Message((Message *)&stack0xfffffffffffffb48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"(bool)im","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffb68,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/integrators_test.cpp"
               ,0x34,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffb68,(Message *)&stack0xfffffffffffffb48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffb68);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&stack0xfffffffffffffb48);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(this);
    pIVar1 = pstd::optional<pbrt::ImageAndMetadata>::value(&im);
    gtest_ar_._0_4_ = *(undefined4 *)&(pIVar1->image).channelNames.nStored;
    iVar7 = 3;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"im->image.NChannels()","3",(int *)&gtest_ar_,
               (int *)&stack0xfffffffffffffb48);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffffb48,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/integrators_test.cpp"
                 ,0x35,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffffb48,(Message *)&gtest_ar_);
      this = &gtest_ar.message_;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffb48);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      pIVar1 = pstd::optional<pbrt::ImageAndMetadata>::value(&im);
      TVar2 = (pIVar1->image).resolution.super_Tuple2<pbrt::Point2,_int>;
      fVar8 = 0.0;
      for (lVar3 = 0; lVar3 < (long)TVar2 >> 0x20; lVar3 = lVar3 + 1) {
        for (uVar5 = 0; (long)uVar5 < (long)TVar2.x; uVar5 = uVar5 + 1) {
          for (c_00 = 0; c_00 != 3; c_00 = c_00 + 1) {
            pbrt::WrapMode2D::WrapMode2D(&local_478,Clamp);
            FVar6 = pbrt::Image::GetChannel
                              (&pIVar1->image,(Point2i)(lVar3 << 0x20 | uVar5),c_00,local_478);
            fVar8 = fVar8 + FVar6;
          }
          TVar2 = (pIVar1->image).resolution.super_Tuple2<pbrt::Point2,_int>;
        }
      }
      testing::internal::DoubleNearPredFormat
                ((char *)CONCAT44(fVar8,in_stack_fffffffffffffb50),
                 (char *)CONCAT44(in_stack_fffffffffffffb4c,iVar7),(char *)0x328e72,
                 (double)CONCAT44(expected,in_stack_fffffffffffffb70),
                 (double)in_stack_fffffffffffffb68.data_,(double)gtest_ar_.message_.ptr_);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xfffffffffffffb48,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/integrators_test.cpp"
                   ,0x40,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xfffffffffffffb48,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffb48);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar_);
      }
      this = &gtest_ar.message_;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(this);
  pstd::optional<pbrt::ImageAndMetadata>::~optional(&im);
  return;
}

Assistant:

void CheckSceneAverage(const std::string &filename, float expected) {
    pstd::optional<ImageAndMetadata> im = Image::Read(filename);
    ASSERT_TRUE((bool)im);
    ASSERT_EQ(im->image.NChannels(), 3);

    float delta = .025;
    float sum = 0;

    Image &image = im->image;
    for (int t = 0; t < image.Resolution()[1]; ++t)
        for (int s = 0; s < image.Resolution()[0]; ++s)
            for (int c = 0; c < 3; ++c)
                sum += image.GetChannel(Point2i(s, t), c);
    int nPixels = image.Resolution().x * image.Resolution().y * 3;
    EXPECT_NEAR(expected, sum / nPixels, delta);
}